

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O0

Result __thiscall cmGeneratorExpressionDAGChecker::CheckGraph(cmGeneratorExpressionDAGChecker *this)

{
  __type _Var1;
  cmGeneratorExpressionDAGChecker *local_20;
  cmGeneratorExpressionDAGChecker *parent;
  cmGeneratorExpressionDAGChecker *this_local;
  
  local_20 = this->Parent;
  while( true ) {
    if (local_20 == (cmGeneratorExpressionDAGChecker *)0x0) {
      return DAG;
    }
    _Var1 = std::operator==(&this->Target,&local_20->Target);
    if ((_Var1) && (_Var1 = std::operator==(&this->Property,&local_20->Property), _Var1)) break;
    local_20 = local_20->Parent;
  }
  if (local_20 != this->Parent) {
    return CYCLIC_REFERENCE;
  }
  return SELF_REFERENCE;
}

Assistant:

cmGeneratorExpressionDAGChecker::Result
cmGeneratorExpressionDAGChecker::CheckGraph() const
{
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    if (this->Target == parent->Target && this->Property == parent->Property) {
      return (parent == this->Parent) ? SELF_REFERENCE : CYCLIC_REFERENCE;
    }
    parent = parent->Parent;
  }
  return DAG;
}